

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

EnumValueDescriptor * __thiscall
google::protobuf::Descriptor::FindEnumValueByName(Descriptor *this,string_view name)

{
  string_view name_00;
  FileDescriptor *pFVar1;
  EnumValueDescriptor *pEVar2;
  Symbol local_28;
  Descriptor *local_20;
  Descriptor *this_local;
  string_view name_local;
  
  name_local._M_len = (size_t)name._M_str;
  this_local = (Descriptor *)name._M_len;
  local_20 = this;
  pFVar1 = file(this);
  name_00._M_str = (char *)name_local._M_len;
  name_00._M_len = (size_t)this_local;
  local_28.ptr_ =
       (SymbolBase *)
       FileDescriptorTables::
       FindNestedSymbol<google::protobuf::(anonymous_namespace)::ParentNameQuery>
                 (pFVar1->tables_,this,name_00);
  pEVar2 = Symbol::enum_value_descriptor(&local_28);
  return pEVar2;
}

Assistant:

const EnumValueDescriptor* Descriptor::FindEnumValueByName(
    absl::string_view name) const {
  return file()->tables_->FindNestedSymbol(this, name).enum_value_descriptor();
}